

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

string * __thiscall
AmpIO::ReadRobotSerialNumber_abi_cxx11_(string *__return_storage_ptr__,AmpIO *this)

{
  BasePort *pBVar1;
  uint32_t uVar2;
  int iVar3;
  int iVar4;
  size_t i;
  long lVar5;
  uint32_t q;
  char buf [33];
  undefined2 local_5c [2];
  char local_58 [40];
  
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_58[0x14] = '\0';
  local_58[0x15] = '\0';
  local_58[0x16] = '\0';
  local_58[0x17] = '\0';
  local_58[0x18] = '\0';
  local_58[0x19] = '\0';
  local_58[0x1a] = '\0';
  local_58[0x1b] = '\0';
  local_58[0x1c] = '\0';
  local_58[0x1d] = '\0';
  local_58[0x1e] = '\0';
  local_58[0x1f] = '\0';
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  local_58[0x20] = 0;
  uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar2 == 0x64524131) {
    iVar4 = 0x1000000;
    for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
      for (iVar3 = 0; iVar3 != 0x20000000; iVar3 = iVar3 + 0x10000000) {
        pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
        (*pBVar1->_vptr_BasePort[0x24])
                  (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,0xa002,
                   (ulong)(uint)(iVar4 + iVar3));
        Amp1394_Sleep(0.01);
      }
      pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
      (*pBVar1->_vptr_BasePort[0x23])
                (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,0xa031);
      *(undefined2 *)(local_58 + lVar5 * 2) = local_5c[0];
      iVar4 = iVar4 + 1;
    }
    pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
    (*pBVar1->_vptr_BasePort[0x24])
              (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,0xa002,0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_58,(allocator<char> *)local_5c);
  return __return_storage_ptr__;
}

Assistant:

std::string AmpIO::ReadRobotSerialNumber() const
{
    // Experimental: implementation will likely change
    const size_t read_length = 16; // 16 words, 32 bytes.
    char buf[read_length * 2 + 1] = {'\0'};
    if (GetHardwareVersion() == dRA1_String) {
        uint16_t* buf16 = reinterpret_cast<uint16_t*>(buf);
        uint32_t base_flash_addr = 0;
        for (size_t i = 0; i < read_length; i++) {
            for (uint32_t flash_en = 0; flash_en < 2; flash_en++) {
                uint32_t flash_command = (flash_en << 28) | (1 << 24) | (base_flash_addr + i) ;
                port->WriteQuadlet(BoardId, 0xa002, flash_command);
                Amp1394_Sleep(0.01);
            }
            uint32_t q;
            port->ReadQuadlet(BoardId, 0xa031, q);
            buf16[i] = q & 0xFFFF;
        }
        port->WriteQuadlet(BoardId, 0xa002, 0);
    }
    std::string serial_number(buf);
    return serial_number;
}